

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

void __thiscall QCss::Declaration::styleValues(Declaration *this,BorderStyle *s)

{
  BorderStyle BVar1;
  DeclarationData *pDVar2;
  P _a;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  pDVar2 = (this->d).d.ptr;
  if ((pDVar2->values).d.size == 0) {
    uVar5 = 0;
  }
  else {
    lVar4 = 0;
    uVar5 = 0;
    do {
      BVar1 = parseStyleValue((Value *)((long)&((pDVar2->values).d.ptr)->type + lVar4));
      s[uVar5] = BVar1;
      uVar5 = uVar5 + 1;
      pDVar2 = (this->d).d.ptr;
      uVar3 = (pDVar2->values).d.size;
      if (3 < (long)uVar3) {
        uVar3 = 4;
      }
      lVar4 = lVar4 + 0x28;
    } while (uVar5 < uVar3);
  }
  switch(uVar5 & 0xffffffff) {
  case 0:
    s[0] = BorderStyle_None;
    s[1] = BorderStyle_None;
    s[2] = BorderStyle_None;
    s[3] = BorderStyle_None;
    break;
  case 1:
    BVar1 = *s;
    s[1] = BVar1;
    s[2] = BVar1;
    goto LAB_005e71df;
  case 2:
    *(undefined8 *)(s + 2) = *(undefined8 *)s;
    break;
  case 3:
    BVar1 = s[1];
LAB_005e71df:
    s[3] = BVar1;
  }
  return;
}

Assistant:

void Declaration::styleValues(BorderStyle *s) const
{
    int i;
    for (i = 0; i < qMin(d->values.size(), 4); i++)
        s[i] = parseStyleValue(d->values.at(i));
    if (i == 0) s[0] = s[1] = s[2] = s[3] = BorderStyle_None;
    else if (i == 1) s[3] = s[2] = s[1] = s[0];
    else if (i == 2) s[2] = s[0], s[3] = s[1];
    else if (i == 3) s[3] = s[1];
}